

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void TableSettingsHandler_ReadLine
               (ImGuiContext *param_1,ImGuiSettingsHandler *param_2,void *entry,char *line)

{
  byte bVar1;
  int iVar2;
  ImGuiTableColumnSettings *pIVar3;
  ImGuiTableColumnSettings *column;
  ImGuiID local_40;
  int iStack_3c;
  char c;
  int n;
  int r;
  int column_n;
  float f;
  ImGuiTableSettings *settings;
  char *line_local;
  void *entry_local;
  ImGuiSettingsHandler *param_1_local;
  ImGuiContext *param_0_local;
  
  r = 0;
  n = 0;
  iStack_3c = 0;
  local_40 = 0;
  _column_n = (ImGuiTableSettings *)entry;
  settings = (ImGuiTableSettings *)line;
  line_local = (char *)entry;
  entry_local = param_2;
  param_1_local = (ImGuiSettingsHandler *)param_1;
  iVar2 = __isoc99_sscanf(line,"RefScale=%f",&r);
  if (iVar2 == 1) {
    _column_n->RefScale = (float)r;
  }
  else {
    iVar2 = __isoc99_sscanf(settings,"Column %d%n",&n,&stack0xffffffffffffffc4);
    if (((iVar2 == 1) && (-1 < n)) && (n < _column_n->ColumnsCount)) {
      settings = (ImGuiTableSettings *)
                 ImStrSkipBlank((char *)((long)&settings->ID + (long)iStack_3c));
      column._7_1_ = '\0';
      pIVar3 = ImGuiTableSettings::GetColumnSettings(_column_n);
      pIVar3 = pIVar3 + n;
      pIVar3->Index = (ImS8)n;
      iVar2 = __isoc99_sscanf(settings,"UserID=0x%08X%n",&local_40,&stack0xffffffffffffffc4);
      if (iVar2 == 1) {
        settings = (ImGuiTableSettings *)
                   ImStrSkipBlank((char *)((long)&settings->ID + (long)iStack_3c));
        pIVar3->UserID = local_40;
      }
      iVar2 = __isoc99_sscanf(settings,"Width=%d%n",&local_40,&stack0xffffffffffffffc4);
      if (iVar2 == 1) {
        settings = (ImGuiTableSettings *)
                   ImStrSkipBlank((char *)((long)&settings->ID + (long)iStack_3c));
        pIVar3->WidthOrWeight = (float)(int)local_40;
        pIVar3->field_0xb = pIVar3->field_0xb & 0xf7;
        _column_n->SaveFlags = _column_n->SaveFlags | 1;
      }
      iVar2 = __isoc99_sscanf(settings,"Weight=%f%n",&r,&stack0xffffffffffffffc4);
      if (iVar2 == 1) {
        settings = (ImGuiTableSettings *)
                   ImStrSkipBlank((char *)((long)&settings->ID + (long)iStack_3c));
        pIVar3->WidthOrWeight = (float)r;
        pIVar3->field_0xb = pIVar3->field_0xb & 0xf7 | 8;
        _column_n->SaveFlags = _column_n->SaveFlags | 1;
      }
      iVar2 = __isoc99_sscanf(settings,"Visible=%d%n",&local_40,&stack0xffffffffffffffc4);
      if (iVar2 == 1) {
        settings = (ImGuiTableSettings *)
                   ImStrSkipBlank((char *)((long)&settings->ID + (long)iStack_3c));
        pIVar3->field_0xb = pIVar3->field_0xb & 0xfb | ((byte)local_40 & 1) << 2;
        _column_n->SaveFlags = _column_n->SaveFlags | 4;
      }
      iVar2 = __isoc99_sscanf(settings,"Order=%d%n",&local_40,&stack0xffffffffffffffc4);
      if (iVar2 == 1) {
        settings = (ImGuiTableSettings *)
                   ImStrSkipBlank((char *)((long)&settings->ID + (long)iStack_3c));
        pIVar3->DisplayOrder = (ImS8)local_40;
        _column_n->SaveFlags = _column_n->SaveFlags | 2;
      }
      iVar2 = __isoc99_sscanf(settings,"Sort=%d%c%n",&local_40,(long)&column + 7,
                              &stack0xffffffffffffffc4);
      if (iVar2 == 2) {
        ImStrSkipBlank((char *)((long)&settings->ID + (long)iStack_3c));
        pIVar3->SortOrder = (ImS8)local_40;
        bVar1 = 1;
        if (column._7_1_ == '^') {
          bVar1 = 2;
        }
        pIVar3->field_0xb = pIVar3->field_0xb & 0xfc | bVar1;
        _column_n->SaveFlags = _column_n->SaveFlags | 8;
      }
    }
  }
  return;
}

Assistant:

static void TableSettingsHandler_ReadLine(ImGuiContext*, ImGuiSettingsHandler*, void* entry, const char* line)
{
    // "Column 0  UserID=0x42AD2D21 Width=100 Visible=1 Order=0 Sort=0v"
    ImGuiTableSettings* settings = (ImGuiTableSettings*)entry;
    float f = 0.0f;
    int column_n = 0, r = 0, n = 0;

    if (sscanf(line, "RefScale=%f", &f) == 1) { settings->RefScale = f; return; }

    if (sscanf(line, "Column %d%n", &column_n, &r) == 1)
    {
        if (column_n < 0 || column_n >= settings->ColumnsCount)
            return;
        line = ImStrSkipBlank(line + r);
        char c = 0;
        ImGuiTableColumnSettings* column = settings->GetColumnSettings() + column_n;
        column->Index = (ImS8)column_n;
        if (sscanf(line, "UserID=0x%08X%n", (ImU32*)&n, &r)==1) { line = ImStrSkipBlank(line + r); column->UserID = (ImGuiID)n; }
        if (sscanf(line, "Width=%d%n", &n, &r) == 1)            { line = ImStrSkipBlank(line + r); column->WidthOrWeight = (float)n; column->IsWeighted = 0; settings->SaveFlags |= ImGuiTableFlags_Resizable; }
        if (sscanf(line, "Weight=%f%n", &f, &r) == 1)           { line = ImStrSkipBlank(line + r); column->WidthOrWeight = f; column->IsWeighted = 1; settings->SaveFlags |= ImGuiTableFlags_Resizable; }
        if (sscanf(line, "Visible=%d%n", &n, &r) == 1)          { line = ImStrSkipBlank(line + r); column->IsVisible = (ImU8)n; settings->SaveFlags |= ImGuiTableFlags_Hideable; }
        if (sscanf(line, "Order=%d%n", &n, &r) == 1)            { line = ImStrSkipBlank(line + r); column->DisplayOrder = (ImS8)n; settings->SaveFlags |= ImGuiTableFlags_Reorderable; }
        if (sscanf(line, "Sort=%d%c%n", &n, &c, &r) == 2)       { line = ImStrSkipBlank(line + r); column->SortOrder = (ImS8)n; column->SortDirection = (c == '^') ? ImGuiSortDirection_Descending : ImGuiSortDirection_Ascending; settings->SaveFlags |= ImGuiTableFlags_Sortable; }
    }
}